

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,PtrOffsetInst *i)

{
  uint32_t uVar1;
  Reg RVar2;
  Reg RVar3;
  OpCode OVar4;
  OpCode OVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  _Head_base<0UL,_arm::Inst_*,_false> local_80;
  VarId local_78;
  OpCode local_64;
  undefined **local_60;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_58;
  undefined **local_50;
  int local_48 [2];
  uint32_t local_40;
  char local_38;
  undefined2 local_37;
  
  local_50 = (undefined **)CONCAT44(local_50._4_4_,(i->ptr).id);
  pmVar6 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at(&this->func->variables,(key_type_conflict *)&local_50);
  uVar7 = (**(code **)(*(pmVar6->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr[1].super_Displayable._vptr_Displayable + 0x18))();
  if ((uVar7 >> 0x20 & 1) == 0) {
    std::__throw_bad_optional_access();
  }
  local_78.super_Displayable._vptr_Displayable = (_func_int **)local_48;
  local_38 = (i->offset).field_0x18;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_38 + 1]._M_data)
            ((anon_class_8_1_a78179b7_conflict *)&local_78,
             (variant<int,_mir::inst::VarId> *)&(i->offset).field_0x8);
  local_50 = &PTR_display_001ecf98;
  local_37._0_1_ = (i->offset).shift;
  local_37._1_1_ = (i->offset).shift_amount;
  if (local_38 == '\x01') {
    uVar1 = this->vreg_gp_counter;
    this->vreg_gp_counter = uVar1 + 1;
    OVar4 = arm::make_register(VirtualGeneralPurpose,uVar1);
    uVar1 = this->vreg_gp_counter;
    this->vreg_gp_counter = uVar1 + 1;
    OVar5 = arm::make_register(VirtualGeneralPurpose,uVar1);
    local_78.super_Displayable._vptr_Displayable = (_func_int **)operator_new(0x38);
    *(undefined4 *)(local_78.super_Displayable._vptr_Displayable + 1) = 6;
    *(undefined1 *)((long)local_78.super_Displayable._vptr_Displayable + 0xc) = 0x10;
    *local_78.super_Displayable._vptr_Displayable = (_func_int *)&PTR_display_001ed930;
    *(OpCode *)(local_78.super_Displayable._vptr_Displayable + 2) = OVar4;
    *(undefined1 *)(local_78.super_Displayable._vptr_Displayable + 6) = 1;
    *(int *)(local_78.super_Displayable._vptr_Displayable + 4) = (int)uVar7;
    local_60 = &PTR_display_001ed820;
    local_78.super_Displayable._vptr_Displayable[3] = (_func_int *)&PTR_display_001ed820;
    local_58 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_78);
    if (local_78.super_Displayable._vptr_Displayable != (_func_int **)0x0) {
      (**(code **)(*local_78.super_Displayable._vptr_Displayable + 0x10))();
    }
    local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_78.id = local_40;
    RVar2 = get_or_alloc_vgp(this,&local_78);
    local_80._M_head_impl = (Inst *)operator_new(0x38);
    local_80._M_head_impl[2].op = OVar4;
    *(undefined2 *)&local_80._M_head_impl[2].cond = 1;
    (local_80._M_head_impl)->op = Mul;
    (local_80._M_head_impl)->cond = Always;
    ((local_80._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(OpCode *)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable = OVar5;
    *(Reg *)((long)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable + 4) = RVar2;
    *(undefined1 *)&local_80._M_head_impl[3].super_Displayable._vptr_Displayable = 0;
    local_80._M_head_impl[2].super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001ed7c0;
    *(undefined ***)&local_80._M_head_impl[1].op = local_60;
    local_64 = OVar5;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_58,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
    if (local_80._M_head_impl != (Inst *)0x0) {
      (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
    }
    local_78.id = (i->super_Inst).dest.id;
    local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    RVar2 = get_or_alloc_vgp(this,&local_78);
    local_78.id = (i->ptr).id;
    local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    RVar3 = get_or_alloc_vgp(this,&local_78);
    local_80._M_head_impl = (Inst *)operator_new(0x38);
    local_80._M_head_impl[2].op = local_64;
    *(undefined2 *)&local_80._M_head_impl[2].cond = 1;
    (local_80._M_head_impl)->op = Add;
    (local_80._M_head_impl)->cond = Always;
    ((local_80._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(Reg *)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable = RVar2;
    *(Reg *)((long)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable + 4) = RVar3;
    *(undefined1 *)&local_80._M_head_impl[3].super_Displayable._vptr_Displayable = 0;
    local_80._M_head_impl[2].super_Displayable._vptr_Displayable =
         (_func_int **)&PTR_display_001ed7c0;
    *(undefined ***)&local_80._M_head_impl[1].op = local_60;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_58,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
  }
  else {
    if (local_38 != '\0') {
      return;
    }
    local_48[0] = (int)uVar7 * local_48[0];
    local_78.id = (i->super_Inst).dest.id;
    local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    RVar2 = get_or_alloc_vgp(this,&local_78);
    local_78.id = (i->ptr).id;
    local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    RVar3 = get_or_alloc_vgp(this,&local_78);
    local_80._M_head_impl = (Inst *)operator_new(0x38);
    (local_80._M_head_impl)->op = Add;
    (local_80._M_head_impl)->cond = Always;
    ((local_80._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001ed8f0;
    *(Reg *)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable = RVar2;
    *(Reg *)((long)&local_80._M_head_impl[1].super_Displayable._vptr_Displayable + 4) = RVar3;
    *(undefined1 *)&local_80._M_head_impl[3].super_Displayable._vptr_Displayable = 1;
    *(int *)&local_80._M_head_impl[2].super_Displayable._vptr_Displayable = local_48[0];
    *(undefined ***)&local_80._M_head_impl[1].op = &PTR_display_001ed820;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_80);
  }
  if (local_80._M_head_impl != (Inst *)0x0) {
    (*((local_80._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::PtrOffsetInst& i) {
  auto& ptr_ty = func.variables.at(i.ptr).ty;
  auto ptr_ty_ = static_cast<mir::types::PtrTy*>(&*ptr_ty);
  auto item_size = ptr_ty_->item->size().value();

  auto offset_value = i.offset;
  if (auto int_val = offset_value.get_if<int32_t>()) {
    *int_val *= item_size;
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        *int_val));
  } else if (auto var_val = offset_value.get_if<mir::inst::VarId>()) {
    auto num_reg = alloc_vgp();
    auto reg = alloc_vgp();
    inst.push_back(
        std::make_unique<Arith2Inst>(OpCode::Mov, num_reg, item_size));
    inst.push_back(std::make_unique<Arith3Inst>(OpCode::Mul, reg,
                                                translate_var_reg(*var_val),
                                                RegisterOperand(num_reg)));
    inst.push_back(std::make_unique<Arith3Inst>(
        arm::OpCode::Add, translate_var_reg(i.dest), translate_var_reg(i.ptr),
        RegisterOperand(reg)));
  }
}